

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TalksDB.hh
# Opt level: O2

void __thiscall cppti::TalksDB::TalksDB(TalksDB *this,TalksDB *b)

{
  pointer pTVar1;
  pointer pSVar2;
  pointer pbVar3;
  pointer plVar4;
  
  pTVar1 = (b->talks).
           super__Vector_base<cppti::TalksDB::TalkRef,_std::allocator<cppti::TalksDB::TalkRef>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->talks).
  super__Vector_base<cppti::TalksDB::TalkRef,_std::allocator<cppti::TalksDB::TalkRef>_>._M_impl.
  super__Vector_impl_data._M_start =
       (b->talks).
       super__Vector_base<cppti::TalksDB::TalkRef,_std::allocator<cppti::TalksDB::TalkRef>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->talks).
  super__Vector_base<cppti::TalksDB::TalkRef,_std::allocator<cppti::TalksDB::TalkRef>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar1;
  (this->talks).
  super__Vector_base<cppti::TalksDB::TalkRef,_std::allocator<cppti::TalksDB::TalkRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (b->talks).
       super__Vector_base<cppti::TalksDB::TalkRef,_std::allocator<cppti::TalksDB::TalkRef>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (b->talks).super__Vector_base<cppti::TalksDB::TalkRef,_std::allocator<cppti::TalksDB::TalkRef>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (b->talks).super__Vector_base<cppti::TalksDB::TalkRef,_std::allocator<cppti::TalksDB::TalkRef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (b->talks).super__Vector_base<cppti::TalksDB::TalkRef,_std::allocator<cppti::TalksDB::TalkRef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->by_speaker)._M_h,&(b->by_speaker)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->by_conference)._M_h,&(b->by_conference)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::reference_wrapper<const_cppti::TalksDB::TalkRef>,_std::allocator<std::reference_wrapper<const_cppti::TalksDB::TalkRef>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->by_tag)._M_h,&(b->by_tag)._M_h);
  pSVar2 = (b->speakers).
           super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->speakers).
  super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>._M_impl.
  super__Vector_impl_data._M_start =
       (b->speakers).
       super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->speakers).
  super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>._M_impl.
  super__Vector_impl_data._M_finish = pSVar2;
  (this->speakers).
  super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (b->speakers).
       super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (b->speakers).
  super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (b->speakers).
  super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (b->speakers).
  super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar3 = (b->conferences).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->conferences).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (b->conferences).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->conferences).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  (this->conferences).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->conferences).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->conferences).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (b->conferences).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (b->conferences).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar3 = (b->tags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (b->tags).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  (this->tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (b->tags).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (b->tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (b->tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (b->tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar4 = (b->years).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->years).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (b->years).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->years).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = plVar4;
  (this->years).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (b->years).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (b->years).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (b->years).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (b->years).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TalksDB(TalksDB&& b) noexcept = default;